

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

char * __thiscall
icu_63::LocaleBased::getLocaleID(LocaleBased *this,ULocDataLocaleType type,UErrorCode *status)

{
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == ULOC_ACTUAL_LOCALE) {
      return this->actual;
    }
    if (type == ULOC_VALID_LOCALE) {
      return this->valid;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }